

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O1

double __thiscall agg::bspline::get(bspline *this,double x)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int i;
  int iVar6;
  double dVar7;
  double dVar8;
  
  iVar3 = this->m_num;
  lVar4 = (long)iVar3;
  if (lVar4 < 3) {
    return 0.0;
  }
  pdVar1 = this->m_x;
  dVar7 = *pdVar1;
  if (dVar7 <= x) {
    if (pdVar1[lVar4 + -1] <= x) {
      dVar8 = pdVar1[lVar4 + -1] - pdVar1[lVar4 + -2];
      dVar7 = this->m_y[lVar4 + -1];
      return (x - pdVar1[lVar4 + -1]) *
             ((dVar7 - this->m_y[lVar4 + -2]) / dVar8 +
             ((this->m_am).m_array[iVar3 - 2] * dVar8) / 6.0) + dVar7;
    }
    iVar3 = iVar3 + -1;
    i = 0;
    iVar5 = 0;
    do {
      iVar6 = iVar5 + iVar3 >> 1;
      iVar2 = iVar6;
      if (pdVar1[iVar6] <= x) {
        iVar5 = iVar6;
        iVar2 = iVar3;
        i = iVar6;
      }
      iVar3 = iVar2;
    } while (1 < iVar3 - iVar5);
    dVar7 = interpolation(this,x,i);
    return dVar7;
  }
  dVar8 = *this->m_y;
  return (x - dVar7) *
         ((this->m_y[1] - dVar8) / (pdVar1[1] - dVar7) +
         ((this->m_am).m_array[1] * (pdVar1[1] - dVar7)) / -6.0) + dVar8;
}

Assistant:

double bspline::get(double x) const
    {
        if(m_num > 2)
        {
            int i;

            // Extrapolation on the left
            if(x < m_x[0]) return extrapolation_left(x);

            // Extrapolation on the right
            if(x >= m_x[m_num - 1]) return extrapolation_right(x);

            // Interpolation
            bsearch(m_num, m_x, x, &i);
            return interpolation(x, i);
        }
        return 0.0;
    }